

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void estimate_coeff(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats)

{
  undefined1 auVar1 [16];
  FIRSTPASS_STATS *pFVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  
  auVar1 = _DAT_0045e1a0;
  for (pFVar2 = first_stats + 1; pFVar2 < last_stats; pFVar2 = pFVar2 + 1) {
    dVar6 = (pFVar2->intra_error - pFVar2->coded_error) * pFVar2[-1].intra_error;
    if (dVar6 <= 0.001) {
      dVar6 = 0.001;
    }
    auVar4._0_8_ = pFVar2[-1].intra_error - pFVar2->noise_var;
    auVar4._8_8_ = pFVar2->intra_error - pFVar2->noise_var;
    auVar4 = maxpd(auVar4,auVar1);
    dVar5 = SQRT(auVar4._0_8_ / auVar4._8_8_) * (SQRT(dVar6) / auVar4._0_8_);
    dVar3 = (double)(~-(ulong)(dVar5 <= 0.0) & ~-(ulong)(dVar5 < 1.0) & 0x3ff0000000000000);
    dVar6 = dVar5;
    if (1.0 <= dVar5) {
      dVar6 = dVar3;
    }
    if (0.0 < dVar5) {
      dVar3 = dVar6;
    }
    pFVar2->cor_coeff = dVar3;
  }
  first_stats->cor_coeff = 1.0;
  return;
}

Assistant:

static void estimate_coeff(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats) {
  FIRSTPASS_STATS *this_stats;
  for (this_stats = first_stats + 1; this_stats < last_stats; this_stats++) {
    const double C =
        sqrt(AOMMAX((this_stats - 1)->intra_error *
                        (this_stats->intra_error - this_stats->coded_error),
                    0.001));
    const double cor_coeff =
        C /
        AOMMAX((this_stats - 1)->intra_error - this_stats->noise_var, 0.001);

    this_stats->cor_coeff =
        cor_coeff *
        sqrt(AOMMAX((this_stats - 1)->intra_error - this_stats->noise_var,
                    0.001) /
             AOMMAX(this_stats->intra_error - this_stats->noise_var, 0.001));
    // clip correlation coefficient.
    this_stats->cor_coeff = AOMMIN(AOMMAX(this_stats->cor_coeff, 0), 1);
  }
  first_stats->cor_coeff = 1.0;
}